

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

void interpolative_internal::decode_interpolative
               (bit_stream *is,uint32_t *out_buf,size_t n,size_t low,size_t high)

{
  long lVar1;
  size_t high_00;
  uint64_t uVar2;
  ulong uVar3;
  
  while( true ) {
    if (n == 0) {
      return;
    }
    uVar3 = n + 1 >> 1;
    lVar1 = (uVar3 - 1) + low;
    uVar2 = read_center_mid(is,(high - (low + n)) + 2);
    high_00 = (uVar2 - 2) + lVar1;
    out_buf[uVar3 - 1] = (uint32_t)high_00;
    if (uVar3 - 1 != 0) {
      decode_interpolative(is,out_buf,uVar3 - 1,low,high_00);
    }
    if (n == uVar3) break;
    low = uVar2 + lVar1;
    n = n - uVar3;
    out_buf = out_buf + uVar3;
  }
  return;
}

Assistant:

static inline void decode_interpolative(
        bit_stream& is, uint32_t* out_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = low + n1 - 1ULL
            + read_center_mid(is, high - n2 - low - n1 + 1ULL);

        out_buf[h - 1] = v - 1; // we don't encode 0
        if (n1)
            decode_interpolative(is, out_buf, n1, low, v - 1ULL);
        if (n2)
            decode_interpolative(is, out_buf + h, n2, v + 1ULL, high);
    }